

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

ssize_t __thiscall kj::InputStream::read(InputStream *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  Fault local_40;
  Fault f;
  size_t n;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  InputStream *this_local;
  
  iVar1 = (*this->_vptr_InputStream[2])(this,CONCAT44(in_register_00000034,__fd),__buf);
  f.exception = (Exception *)CONCAT44(extraout_var,iVar1);
  this_local = (InputStream *)f.exception;
  if (f.exception < __buf) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[14]>
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
               ,0x35,FAILED,"n >= minBytes","\"Premature EOF\"",(char (*) [14])"Premature EOF");
    memset((void *)((long)(f.exception)->trace + CONCAT44(in_register_00000034,__fd) + -0x50),0,
           (long)__buf - (long)f.exception);
    _::Debug::Fault::~Fault(&local_40);
    this_local = (InputStream *)__buf;
  }
  return (ssize_t)this_local;
}

Assistant:

size_t InputStream::read(void* buffer, size_t minBytes, size_t maxBytes) {
  size_t n = tryRead(buffer, minBytes, maxBytes);
  KJ_REQUIRE(n >= minBytes, "Premature EOF") {
    // Pretend we read zeros from the input.
    memset(reinterpret_cast<byte*>(buffer) + n, 0, minBytes - n);
    return minBytes;
  }
  return n;
}